

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void btreeEndTransaction(Btree *p)

{
  BtShared *pBt_00;
  sqlite3 *psVar1;
  sqlite3 *db;
  BtShared *pBt;
  Btree *p_local;
  
  pBt_00 = p->pBt;
  psVar1 = p->db;
  pBt_00->bDoTruncate = '\0';
  if ((p->inTrans == '\0') || (psVar1->nVdbeRead < 2)) {
    if (p->inTrans != '\0') {
      clearAllSharedCacheTableLocks(p);
      pBt_00->nTransaction = pBt_00->nTransaction + -1;
      if (pBt_00->nTransaction == 0) {
        pBt_00->inTransaction = '\0';
      }
    }
    p->inTrans = '\0';
    unlockBtreeIfUnused(pBt_00);
  }
  else {
    downgradeAllSharedCacheTableLocks(p);
    p->inTrans = '\x01';
  }
  return;
}

Assistant:

static void btreeEndTransaction(Btree *p){
  BtShared *pBt = p->pBt;
  sqlite3 *db = p->db;
  assert( sqlite3BtreeHoldsMutex(p) );

#ifndef SQLITE_OMIT_AUTOVACUUM
  pBt->bDoTruncate = 0;
#endif
  if( p->inTrans>TRANS_NONE && db->nVdbeRead>1 ){
    /* If there are other active statements that belong to this database
    ** handle, downgrade to a read-only transaction. The other statements
    ** may still be reading from the database.  */
    downgradeAllSharedCacheTableLocks(p);
    p->inTrans = TRANS_READ;
  }else{
    /* If the handle had any kind of transaction open, decrement the
    ** transaction count of the shared btree. If the transaction count
    ** reaches 0, set the shared state to TRANS_NONE. The unlockBtreeIfUnused()
    ** call below will unlock the pager.  */
    if( p->inTrans!=TRANS_NONE ){
      clearAllSharedCacheTableLocks(p);
      pBt->nTransaction--;
      if( 0==pBt->nTransaction ){
        pBt->inTransaction = TRANS_NONE;
      }
    }

    /* Set the current transaction state to TRANS_NONE and unlock the
    ** pager if this call closed the only read or write transaction.  */
    p->inTrans = TRANS_NONE;
    unlockBtreeIfUnused(pBt);
  }

  btreeIntegrity(p);
}